

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.cpp
# Opt level: O3

header_info * __thiscall
pstore::http::header_info::handler
          (header_info *__return_storage_ptr__,header_info *this,string *key,string *value)

{
  int iVar1;
  const_iterator cVar2;
  uint *puVar3;
  type *ptVar4;
  undefined8 uVar5;
  long lVar6;
  bool bVar7;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  undefined2 local_168 [4];
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_160;
  char local_138;
  uint local_134;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_130 [4];
  
  if (handler(std::__cxx11::string_const&,std::__cxx11::string_const&)::handlers_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&handler(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                                 handlers_abi_cxx11_);
    if (iVar1 != 0) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::
      pair<const_char_(&)[11],_pstore::http::header_info_(&)(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_true>
                (local_130,(char (*) [11])"connection",anon_unknown.dwarf_96885::connection);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::
      pair<const_char_(&)[8],_pstore::http::header_info_(&)(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_true>
                (local_130 + 1,(char (*) [8])0x125981,anon_unknown.dwarf_96885::upgrade);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::
      pair<const_char_(&)[18],_pstore::http::header_info_(&)(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_true>
                (local_130 + 2,(char (*) [18])"sec-websocket-key",
                 anon_unknown.dwarf_96885::sec_websocket_key);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::
      pair<const_char_(&)[22],_pstore::http::header_info_(&)(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_true>
                (local_130 + 3,(char (*) [22])"sec-websocket-version",
                 anon_unknown.dwarf_96885::sec_websocket_version);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<pstore::http::header_info(pstore::http::header_info,std::__cxx11::string_const&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<pstore::http::header_info(pstore::http::header_info,std::__cxx11::string_const&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _Hashtable<std::pair<std::__cxx11::string_const,std::function<pstore::http::header_info(pstore::http::header_info,std::__cxx11::string_const&)>>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<pstore::http::header_info(pstore::http::header_info,std::__cxx11::string_const&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<pstore::http::header_info(pstore::http::header_info,std::__cxx11::string_const&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&handler(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                     handlers_abi_cxx11_,local_130,&stack0xffffffffffffffd0,0,&local_169,&local_16a,
                 &local_16b);
      lVar6 = 0xc0;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                 *)((long)&local_130[0].first._M_dataplus._M_p + lVar6));
        lVar6 = lVar6 + -0x40;
      } while (lVar6 != -0x40);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
                   ::~unordered_map,
                   &handler(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                    handlers_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&handler(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                           handlers_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&handler(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                  handlers_abi_cxx11_._M_h,key);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar7 = this->connection_upgrade;
    __return_storage_ptr__->upgrade_to_websocket = this->upgrade_to_websocket;
    __return_storage_ptr__->connection_upgrade = bVar7;
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    maybe(&__return_storage_ptr__->websocket_key,&this->websocket_key);
    (__return_storage_ptr__->websocket_version).valid_ = false;
    if ((this->websocket_version).valid_ == true) {
      ptVar4 = (type *)maybe<unsigned_int,_void>::operator->(&this->websocket_version);
      (__return_storage_ptr__->websocket_version).storage_ = *ptVar4;
      (__return_storage_ptr__->websocket_version).valid_ = true;
    }
  }
  else {
    local_168[0]._0_1_ = this->upgrade_to_websocket;
    local_168[0]._1_1_ = this->connection_upgrade;
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    maybe(&local_160,&this->websocket_key);
    local_138 = 0;
    bVar7 = (this->websocket_version).valid_ == true;
    if (bVar7) {
      puVar3 = maybe<unsigned_int,_void>::operator->(&this->websocket_version);
      local_134 = *puVar3;
    }
    local_138 = bVar7;
    if (*(long *)((long)cVar2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_true>
                        ._M_cur + 0x38) == 0) {
      uVar5 = std::__throw_bad_function_call();
      lVar6 = 0xc0;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                 *)((long)&local_130[0].first._M_dataplus._M_p + lVar6));
        lVar6 = lVar6 + -0x40;
      } while (lVar6 != -0x40);
      __cxa_guard_abort(&handler(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         handlers_abi_cxx11_);
      _Unwind_Resume(uVar5);
    }
    (**(code **)((long)cVar2.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_true>
                       ._M_cur + 0x40))
              (__return_storage_ptr__,
               (long)cVar2.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::http::header_info_(pstore::http::header_info,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_true>
                     ._M_cur + 0x28,local_168,value);
    if (local_138 == '\x01') {
      local_138 = '\0';
    }
    if (local_160.valid_ == true) {
      local_160.valid_ = false;
      if (local_160.storage_.__align !=
          (anon_struct_8_0_00000001_for___align)((long)&local_160.storage_ + 0x10)) {
        operator_delete((void *)local_160.storage_.__align,local_160.storage_._16_8_ + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

header_info pstore::http::header_info::handler (std::string const & key,
                                                std::string const & value) {
    static std::unordered_map<
        std::string, std::function<header_info (header_info, std::string const & value)>> const
        handlers = {
            {"connection", connection},
            {"upgrade", upgrade},
            {"sec-websocket-key", sec_websocket_key},
            {"sec-websocket-version", sec_websocket_version},
        };
    auto const pos = handlers.find (key);
    return pos != handlers.end () ? pos->second (*this, value) : *this;
}